

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack8to4_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m256 _v;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00001600;
  Mat *in_stack_00001608;
  Mat *in_stack_00001610;
  Mat *in_stack_00001618;
  Mat *in_stack_00001620;
  int in_stack_fffffffffffffbbc;
  size_t in_stack_fffffffffffffbc0;
  void **ppvVar1;
  undefined8 in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  Mat *in_stack_fffffffffffffbd8;
  Allocator *in_stack_fffffffffffffc38;
  int local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  int local_3b0;
  int local_3ac;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  long *local_388;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined8 local_368;
  undefined8 *local_360;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined4 local_330;
  long local_328;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined8 local_308;
  int local_300;
  int local_2fc;
  void *local_2f8;
  int *local_2f0;
  long local_2e8;
  undefined4 local_2e0;
  long *local_2d8;
  undefined4 local_2d0;
  int local_2cc;
  int local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  long local_2b8;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  long *local_278;
  undefined8 *local_270;
  undefined8 *local_260;
  void **local_250;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  undefined8 *local_208;
  undefined8 *local_1e8;
  undefined1 local_1dd;
  int local_1dc;
  void **local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  undefined1 local_195;
  int local_194;
  undefined8 *local_188;
  void *local_138;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  void **local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long *local_88;
  undefined4 local_7c;
  long local_78;
  undefined8 *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_29c = *(int *)((long)in_RDI + 0x2c);
  local_2a0 = (int)in_RDI[7];
  local_2a4 = *(int *)(in_RSI + 0x2c);
  local_2a8 = *(int *)(in_RSI + 0x30);
  local_2ac = local_2a4 * local_2a8;
  local_2b0 = in_R8D * in_R9D;
  local_f0 = *(undefined8 *)(CONCAT44(in_stack_0000002c,stride_h) + 0x10);
  local_c8 = &local_2f8;
  local_e0 = 0x20;
  local_e4 = 8;
  local_2f8 = (void *)0x0;
  local_2f0 = (int *)0x0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_2d8 = (long *)0x0;
  local_2d0 = 0;
  local_2cc = 0;
  local_2c8 = 0;
  local_2c4 = 0;
  local_2c0 = 0;
  local_2b8 = 0;
  local_298 = in_R9D;
  local_294 = in_R8D;
  local_278 = in_RDI;
  local_d4 = local_2a0;
  local_d0 = local_2b0;
  local_cc = local_2ac;
  Mat::create(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
              (int)in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
              in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_fffffffffffffc38);
  local_2fc = (local_29c * stride_w - local_2a4 * dilation_h) * 8;
  for (local_300 = 0; local_300 < local_2a0; local_300 = local_300 + 1) {
    local_188 = &local_348;
    local_94 = *(int *)((long)local_278 + 0x2c);
    local_98 = (int)local_278[6];
    local_9c = *(undefined4 *)((long)local_278 + 0x34);
    local_a8 = *local_278 + local_278[8] * (long)local_300 * local_278[2];
    local_b0 = local_278[2];
    local_b4 = (undefined4)local_278[3];
    local_c0 = local_278[4];
    local_90 = &local_348;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_1d0 = &local_3a8;
    local_1d8 = &local_2f8;
    local_70 = (undefined8 *)((long)local_2f8 + local_2b8 * local_300 * local_2e8);
    local_58 = &local_3a8;
    local_48 = (long)local_2cc * (long)local_2c8 * local_2e8;
    local_1b0 = &local_3a8;
    local_270 = &local_3a8;
    local_388 = local_2d8;
    local_3a8 = 0;
    local_398 = 0;
    local_390 = 0;
    local_380 = 0;
    local_37c = 0;
    local_378 = 0;
    local_374 = 0;
    local_370 = 0;
    local_368 = 0;
    local_3a0 = 0;
    local_360 = local_70;
    for (local_3ac = 0; local_3ac < local_298; local_3ac = local_3ac + 1) {
      for (local_3b0 = 0; local_3b0 < local_294; local_3b0 = local_3b0 + 1) {
        local_1a4 = dilation_w * local_3ac;
        local_1a0 = &local_348;
        local_3b8 = (undefined8 *)
                    (local_a8 + (long)local_94 * (long)local_1a4 * local_b0 +
                    (long)(in_stack_00000008 * local_3b0 * 8) * 4);
        for (local_3bc = 0; local_3bc < local_2a8; local_3bc = local_3bc + 1) {
          for (local_3c0 = 0; local_3c0 < local_2a4; local_3c0 = local_3c0 + 1) {
            local_128 = local_3b8;
            local_120 = *local_3b8;
            uStack_118 = local_3b8[1];
            uStack_110 = local_3b8[2];
            uStack_108 = local_3b8[3];
            local_f8 = local_360;
            *local_360 = local_120;
            local_360[1] = uStack_118;
            local_360[2] = uStack_110;
            local_360[3] = uStack_108;
            local_3b8 = (undefined8 *)((long)local_3b8 + (long)(dilation_h << 3) * 4);
            local_360 = local_360 + 4;
          }
          local_3b8 = (undefined8 *)((long)local_3b8 + (long)local_2fc * 4);
        }
      }
    }
    local_260 = &local_348;
    local_3c = 0x10;
    local_4c = 0x10;
    local_5c = local_2cc;
    local_60 = local_2c8;
    local_64 = local_2c4;
    local_78 = local_2e8;
    local_7c = local_2e0;
    local_88 = local_2d8;
    local_194 = local_300;
    local_195 = 1;
    local_1dc = local_300;
    local_1dd = 1;
    local_348 = 0;
    local_338 = 0;
    local_330 = 0;
    local_320 = 0;
    local_31c = 0;
    local_318 = 0;
    local_314 = 0;
    local_310 = 0;
    local_308 = 0;
    local_340 = 0;
    local_208 = local_260;
    local_1e8 = local_270;
    local_328 = local_c0;
  }
  im2col_sgemm_pack8to4_avx
            (in_stack_00001620,in_stack_00001618,in_stack_00001610,in_stack_00001608,
             in_stack_00001600);
  ppvVar1 = &local_2f8;
  if (local_2f0 != (int *)0x0) {
    local_22c = 0xffffffff;
    LOCK();
    local_230 = *local_2f0;
    *local_2f0 = *local_2f0 + -1;
    UNLOCK();
    if (local_230 == 1) {
      local_250 = ppvVar1;
      local_228 = ppvVar1;
      if (local_2d8 == (long *)0x0) {
        local_138 = local_2f8;
        if (local_2f8 != (void *)0x0) {
          free(local_2f8);
        }
      }
      else {
        (**(code **)(*local_2d8 + 0x18))(local_2d8,local_2f8);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack8to4_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);
    {
        const int gap = (w * stride_h - outw * stride_w) * 8;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            float* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const float* sptr = img.row(dilation_h * u) + dilation_w * v * 8;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            __m256 _v = _mm256_load_ps(sptr);
                            _mm256_store_ps(ptr, _v);

                            sptr += stride_w * 8;
                            ptr += 8;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack8to4_avx(bottom_im2col, top_blob, kernel, _bias, opt);
}